

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plastic.hpp
# Opt level: O3

Color __thiscall
PlasticBSDF::sample_f
          (PlasticBSDF *this,Color *albedo,vec3f *wo,vec3f *wi,float *pdf,bool *isDirac,
          Sampler *sampler)

{
  ulong uVar1;
  float extraout_XMM0_Da;
  undefined8 extraout_XMM0_Qa;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  Color CVar6;
  
  fVar5 = ABS(wo->z);
  fVar4 = *(float *)&(this->super_BSDF).field_0x24;
  fVar3 = 1.0;
  fVar2 = 1.0 - fVar5 * fVar5;
  if (fVar2 <= 0.0) {
    fVar2 = 0.0;
  }
  fVar2 = SQRT(fVar2) / fVar4;
  if (fVar2 < 1.0) {
    fVar2 = 1.0 - fVar2 * fVar2;
    if (fVar2 < 0.0) {
      fVar2 = sqrtf(fVar2);
    }
    else {
      fVar2 = SQRT(fVar2);
    }
    fVar3 = (fVar4 * fVar5 - fVar2) / (fVar4 * fVar5 + fVar2);
    fVar4 = (fVar5 - fVar4 * fVar2) / (fVar4 * fVar2 + fVar5);
    fVar3 = (fVar4 * fVar4 + fVar3 * fVar3) * 0.5;
  }
  (**sampler->_vptr_Sampler)(sampler);
  if (fVar3 <= extraout_XMM0_Da) {
    *isDirac = false;
    fVar4 = fVar3;
    (*sampler->_vptr_Sampler[6])(sampler);
    wi->x = (float)(int)extraout_XMM0_Qa;
    wi->y = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
    wi->z = fVar4;
    *pdf = ((1.0 - fVar3) * fVar4) / PI;
    if (wo->z <= 0.0 && wo->z != 0.0) {
      wi->z = -wi->z;
    }
    CVar6 = f(this,albedo,wo,wi);
  }
  else {
    *pdf = fVar3;
    *isDirac = true;
    fVar4 = wo->z;
    uVar1._0_4_ = wo->x;
    uVar1._4_4_ = wo->y;
    wi->x = (float)(int)(uVar1 ^ 0x8000000080000000);
    wi->y = (float)(int)((uVar1 ^ 0x8000000080000000) >> 0x20);
    wi->z = fVar4;
    fVar3 = fVar3 / ABS(fVar4);
    CVar6.y = fVar3;
    CVar6.x = fVar3;
    CVar6.z = fVar3;
  }
  return CVar6;
}

Assistant:

Color sample_f(const Color& albedo, const vec3f& wo, vec3f& wi, float& pdf, bool& isDirac, Sampler& sampler) const
	{
		float r = DielectricBRDF::reflectivity(fabs(wo.z), IOR);
		// specular reflection
		if (sampler.get1f() < r) {
			pdf = r;
			isDirac = true;
			wi = vec3f(-wo.x, -wo.y, wo.z);
			return r / fabs(wi.z);
		}
		// diffuse reflection
		isDirac = false;
		// wi from inner surface
		wi = sampler.cosSampleHemisphereSurface();
		pdf = (1-r) * wi.z / PI;
		if (wo.z<0) wi.z *= -1;
		return f(albedo, wo, wi);
		// wi = sampler.cosSampleHemisphereSurface();
		// pdf = wi.z/PI;
		// if (wo.z<0) wi.z *= -1;
		// return f(wo, wi);
		// // diffuse component only !!!!!!!
	}